

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::
list_elem<trompeloeil::side_effect_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
::~list_elem(list_elem<trompeloeil::side_effect_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
             *this)

{
  list_elem<trompeloeil::side_effect_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
  *plVar1;
  list_elem<trompeloeil::side_effect_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
  *plVar2;
  
  this->_vptr_list_elem = (_func_int **)&PTR__list_elem_003cd5b8;
  plVar1 = this->next;
  plVar2 = this->prev;
  plVar1->prev = plVar2;
  plVar2->next = plVar1;
  operator_delete(this,0x18);
  return;
}

Assistant:

virtual
    ~list_elem()
    {
      unlink();
    }